

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

Super_Gate_t_conflict *
Super_CreateGateNew(Super_Man_t *pMan,Mio_Gate_t *pRoot,Super_Gate_t_conflict **pSupers,int nSupers,
                   uint *uTruth,float Area,float *tPinDelaysRes,float tDelayMax,int nPins)

{
  Super_Gate_t_conflict *pSVar1;
  
  pSVar1 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
  *(undefined8 *)&pSVar1->field_0x8 = 0;
  *(undefined8 *)(pSVar1->uTruth + 1) = 0;
  pSVar1->pFanins[0] = (Super_Gate_t *)0x0;
  pSVar1->pFanins[1] = (Super_Gate_t *)0x0;
  pSVar1->pFanins[2] = (Super_Gate_t *)0x0;
  pSVar1->pFanins[3] = (Super_Gate_t *)0x0;
  pSVar1->pFanins[4] = (Super_Gate_t *)0x0;
  pSVar1->pFanins[5] = (Super_Gate_t *)0x0;
  pSVar1->Area = 0.0;
  pSVar1->ptDelays[0] = 0.0;
  pSVar1->ptDelays[1] = 0.0;
  pSVar1->ptDelays[2] = 0.0;
  pSVar1->pNext = (Super_Gate_t_conflict *)0x0;
  pSVar1->ptDelays[3] = 0.0;
  pSVar1->ptDelays[4] = 0.0;
  *(undefined8 *)(pSVar1->ptDelays + 5) = 0;
  pSVar1->pRoot = pRoot;
  pSVar1->uTruth[0] = *uTruth;
  pSVar1->uTruth[1] = uTruth[1];
  memcpy(pSVar1->ptDelays,tPinDelaysRes,(long)nPins << 2);
  pSVar1->Area = Area;
  *(uint *)&pSVar1->field_0x8 = nSupers * 4 & 0xff;
  memcpy(pSVar1->pFanins,pSupers,(ulong)(uint)nSupers << 3);
  pSVar1->pNext = (Super_Gate_t_conflict *)0x0;
  pSVar1->tDelayMax = tDelayMax;
  return pSVar1;
}

Assistant:

Super_Gate_t * Super_CreateGateNew( Super_Man_t * pMan, Mio_Gate_t * pRoot, Super_Gate_t ** pSupers, int nSupers, 
    unsigned uTruth[], float Area, float tPinDelaysRes[], float tDelayMax, int nPins )
{
    Super_Gate_t * pSuper;
    pSuper = (Super_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
    memset( pSuper, 0, sizeof(Super_Gate_t) );
    pSuper->pRoot     = pRoot;
    pSuper->uTruth[0] = uTruth[0];
    pSuper->uTruth[1] = uTruth[1];
    memcpy( pSuper->ptDelays, tPinDelaysRes, sizeof(float) * nPins );
    pSuper->Area      = Area;
    pSuper->nFanins   = nSupers;
    memcpy( pSuper->pFanins, pSupers, sizeof(Super_Gate_t *) * nSupers );
    pSuper->pNext     = NULL;
    pSuper->tDelayMax = tDelayMax;
    return pSuper;
}